

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

DdNode * Abc_NodeGlobalBdds_rec
                   (DdManager *dd,Abc_Obj_t *pNode,int nBddSizeMax,int fDropInternal,
                   ProgressBar *pProgress,int *pCounter,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  undefined8 uVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *n;
  long lVar11;
  int iVar12;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                  ,0x178,
                  "DdNode *Abc_NodeGlobalBdds_rec(DdManager *, Abc_Obj_t *, int, int, ProgressBar *, int *, int)"
                 );
  }
  uVar5 = Cudd_ReadKeys(dd);
  uVar6 = Cudd_ReadDead(dd);
  if ((uint)nBddSizeMax < uVar5 - uVar6) {
    Extra_ProgressBarStop(pProgress);
    if (fVerbose != 0) {
      printf("The number of live nodes reached %d.\n",(ulong)(uint)nBddSizeMax);
    }
    fflush(_stdout);
  }
  pVVar3 = pNode->pNtk->vAttrs;
  if (pVVar3->nSize < 8) goto LAB_002db399;
  piVar4 = (int *)pVVar3->pArray[7];
  pvVar7 = *(void **)(piVar4 + 2);
  if (pvVar7 == (void *)0x0) goto LAB_002db3d7;
  iVar1 = pNode->Id;
  lVar11 = (long)iVar1;
  iVar2 = *piVar4;
  if (iVar2 <= iVar1) {
    iVar12 = iVar1 + 10;
    if (iVar1 < iVar2 * 2) {
      iVar12 = iVar2 * 2;
    }
    if (iVar2 < iVar12) {
      pvVar7 = realloc(pvVar7,(long)iVar12 * 8);
      *(void **)(piVar4 + 2) = pvVar7;
      memset((void *)((long)pvVar7 + (long)*piVar4 * 8),0,((long)iVar12 - (long)*piVar4) * 8);
      *piVar4 = iVar12;
    }
  }
  if (*(long *)((long)pvVar7 + lVar11 * 8) == 0) {
    if (*(code **)(piVar4 + 8) != (code *)0x0) {
      uVar8 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
      *(undefined8 *)(*(long *)(piVar4 + 2) + lVar11 * 8) = uVar8;
      if (*(long *)(*(long *)(piVar4 + 2) + lVar11 * 8) != 0) goto LAB_002daf72;
    }
    pDVar9 = Abc_NodeGlobalBdds_rec
                       (dd,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],
                        nBddSizeMax,fDropInternal,pProgress,pCounter,fVerbose);
    if (pDVar9 != (DdNode *)0x0) {
      Cudd_Ref(pDVar9);
      pDVar10 = Abc_NodeGlobalBdds_rec
                          (dd,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],
                           nBddSizeMax,fDropInternal,pProgress,pCounter,fVerbose);
      if (pDVar10 != (DdNode *)0x0) {
        Cudd_Ref(pDVar10);
        pDVar9 = (DdNode *)((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^ (ulong)pDVar9);
        pDVar10 = (DdNode *)((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^ (ulong)pDVar10);
        n = Cudd_bddAndLimit(dd,pDVar9,pDVar10,nBddSizeMax);
        if (n != (DdNode *)0x0) {
          Cudd_Ref(n);
          Cudd_RecursiveDeref(dd,pDVar9);
          Cudd_RecursiveDeref(dd,pDVar10);
          *pCounter = *pCounter + 1;
          pVVar3 = pNode->pNtk->vAttrs;
          if (pVVar3->nSize < 8) goto LAB_002db399;
          piVar4 = (int *)pVVar3->pArray[7];
          pvVar7 = *(void **)(piVar4 + 2);
          if (pvVar7 == (void *)0x0) goto LAB_002db3d7;
          iVar1 = pNode->Id;
          lVar11 = (long)iVar1;
          iVar2 = *piVar4;
          if (iVar2 <= iVar1) {
            iVar12 = iVar1 + 10;
            if (iVar1 < iVar2 * 2) {
              iVar12 = iVar2 * 2;
            }
            if (iVar2 < iVar12) {
              pvVar7 = realloc(pvVar7,(long)iVar12 * 8);
              *(void **)(piVar4 + 2) = pvVar7;
              memset((void *)((long)pvVar7 + (long)*piVar4 * 8),0,((long)iVar12 - (long)*piVar4) * 8
                    );
              *piVar4 = iVar12;
            }
          }
          if (*(long *)((long)pvVar7 + lVar11 * 8) != 0) {
LAB_002db434:
            __assert_fail("Abc_ObjGlobalBdd(pNode) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNtbdd.c"
                          ,0x1c8,
                          "DdNode *Abc_NodeGlobalBdds_rec(DdManager *, Abc_Obj_t *, int, int, ProgressBar *, int *, int)"
                         );
          }
          if (*(code **)(piVar4 + 8) != (code *)0x0) {
            uVar8 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
            *(undefined8 *)(*(long *)(piVar4 + 2) + lVar11 * 8) = uVar8;
            if (*(long *)(*(long *)(piVar4 + 2) + lVar11 * 8) != 0) goto LAB_002db434;
          }
          pVVar3 = pNode->pNtk->vAttrs;
          if (pVVar3->nSize < 8) goto LAB_002db399;
          piVar4 = (int *)pVVar3->pArray[7];
          pvVar7 = *(void **)(piVar4 + 2);
          if (pvVar7 == (void *)0x0) goto LAB_002db3f6;
          if (*(long *)(piVar4 + 8) != 0) goto LAB_002db415;
          iVar1 = pNode->Id;
          iVar2 = *piVar4;
          if (iVar2 <= iVar1) {
            iVar12 = iVar1 + 10;
            if (iVar1 < iVar2 * 2) {
              iVar12 = iVar2 * 2;
            }
            if (iVar2 < iVar12) {
              pvVar7 = realloc(pvVar7,(long)iVar12 * 8);
              *(void **)(piVar4 + 2) = pvVar7;
              memset((void *)((long)pvVar7 + (long)*piVar4 * 8),0,((long)iVar12 - (long)*piVar4) * 8
                    );
              *piVar4 = iVar12;
            }
          }
          *(DdNode **)((long)pvVar7 + (long)iVar1 * 8) = n;
          if ((pProgress != (ProgressBar *)0x0) && (pProgress->nItemsNext <= *pCounter)) {
            Extra_ProgressBarUpdate_int(pProgress,*pCounter,(char *)0x0);
          }
          goto LAB_002daf72;
        }
      }
    }
    pDVar9 = (DdNode *)0x0;
  }
  else {
LAB_002daf72:
    pVVar3 = pNode->pNtk->vAttrs;
    if (pVVar3->nSize < 8) {
LAB_002db399:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    piVar4 = (int *)pVVar3->pArray[7];
    pvVar7 = *(void **)(piVar4 + 2);
    if (pvVar7 == (void *)0x0) {
LAB_002db3d7:
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecAtt.h"
                    ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
    }
    iVar1 = pNode->Id;
    lVar11 = (long)iVar1;
    iVar2 = *piVar4;
    if (iVar2 <= iVar1) {
      iVar12 = iVar1 + 10;
      if (iVar1 < iVar2 * 2) {
        iVar12 = iVar2 * 2;
      }
      if (iVar2 < iVar12) {
        pvVar7 = realloc(pvVar7,(long)iVar12 * 8);
        *(void **)(piVar4 + 2) = pvVar7;
        memset((void *)((long)pvVar7 + (long)*piVar4 * 8),0,((long)iVar12 - (long)*piVar4) * 8);
        *piVar4 = iVar12;
      }
    }
    pDVar9 = *(DdNode **)((long)pvVar7 + lVar11 * 8);
    if (pDVar9 == (DdNode *)0x0) {
      if (*(code **)(piVar4 + 8) == (code *)0x0) {
        pDVar9 = (DdNode *)0x0;
      }
      else {
        uVar8 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
        *(undefined8 *)(*(long *)(piVar4 + 2) + lVar11 * 8) = uVar8;
        pDVar9 = *(DdNode **)(*(long *)(piVar4 + 2) + lVar11 * 8);
      }
    }
    piVar4 = &(pNode->vFanouts).nSize;
    *piVar4 = *piVar4 + -1;
    if (fDropInternal != 0 && *piVar4 == 0) {
      Cudd_Deref(pDVar9);
      pVVar3 = pNode->pNtk->vAttrs;
      if (pVVar3->nSize < 8) goto LAB_002db399;
      piVar4 = (int *)pVVar3->pArray[7];
      pvVar7 = *(void **)(piVar4 + 2);
      if (pvVar7 == (void *)0x0) {
LAB_002db3f6:
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecAtt.h"
                      ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      if (*(long *)(piVar4 + 8) != 0) {
LAB_002db415:
        __assert_fail("p->pFuncStartObj == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecAtt.h"
                      ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
      }
      iVar1 = pNode->Id;
      iVar2 = *piVar4;
      if (iVar2 <= iVar1) {
        iVar12 = iVar1 + 10;
        if (iVar1 < iVar2 * 2) {
          iVar12 = iVar2 * 2;
        }
        if (iVar2 < iVar12) {
          pvVar7 = realloc(pvVar7,(long)iVar12 * 8);
          *(void **)(piVar4 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar4 * 8),0,((long)iVar12 - (long)*piVar4) * 8);
          *piVar4 = iVar12;
        }
      }
      *(undefined8 *)((long)pvVar7 + (long)iVar1 * 8) = 0;
    }
  }
  return pDVar9;
}

Assistant:

DdNode * Abc_NodeGlobalBdds_rec( DdManager * dd, Abc_Obj_t * pNode, int nBddSizeMax, int fDropInternal, ProgressBar * pProgress, int * pCounter, int fVerbose )
{
    DdNode * bFunc, * bFunc0, * bFunc1, * bFuncC;
    int fDetectMuxes = 0;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( Cudd_ReadKeys(dd)-Cudd_ReadDead(dd) > (unsigned)nBddSizeMax )
    {
        Extra_ProgressBarStop( pProgress );
        if ( fVerbose )
        printf( "The number of live nodes reached %d.\n", nBddSizeMax );
        fflush( stdout );
        return NULL;
    }
    // if the result is available return
    if ( Abc_ObjGlobalBdd(pNode) == NULL )
    {
        Abc_Obj_t * pNodeC, * pNode0, * pNode1;
        pNode0 = Abc_ObjFanin0(pNode);
        pNode1 = Abc_ObjFanin1(pNode);
        // check for the special case when it is MUX/EXOR
        if ( fDetectMuxes && 
             Abc_ObjGlobalBdd(pNode0) == NULL && Abc_ObjGlobalBdd(pNode1) == NULL &&
             Abc_ObjIsNode(pNode0) && Abc_ObjFanoutNum(pNode0) == 1 && 
             Abc_ObjIsNode(pNode1) && Abc_ObjFanoutNum(pNode1) == 1 && 
             Abc_NodeIsMuxType(pNode) )
        {
            // deref the fanins
            pNode0->vFanouts.nSize--;
            pNode1->vFanouts.nSize--;
            // recognize the MUX
            pNodeC = Abc_NodeRecognizeMux( pNode, &pNode1, &pNode0 );
            assert( Abc_ObjFanoutNum(pNodeC) > 1 );
            // dereference the control once (the second time it will be derefed when BDDs are computed)
            pNodeC->vFanouts.nSize--;

            // compute the result for all branches
            bFuncC = Abc_NodeGlobalBdds_rec( dd, pNodeC, nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFuncC == NULL )
                return NULL;
            Cudd_Ref( bFuncC );
            bFunc0 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjRegular(pNode0), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc0 == NULL )
                return NULL;
            Cudd_Ref( bFunc0 );
            bFunc1 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjRegular(pNode1), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc1 == NULL )
                return NULL;
            Cudd_Ref( bFunc1 );

            // complement the branch BDDs
            bFunc0 = Cudd_NotCond( bFunc0, (int)Abc_ObjIsComplement(pNode0) );
            bFunc1 = Cudd_NotCond( bFunc1, (int)Abc_ObjIsComplement(pNode1) );
            // get the final result
            bFunc = Cudd_bddIte( dd, bFuncC, bFunc1, bFunc0 );   Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc0 );
            Cudd_RecursiveDeref( dd, bFunc1 );
            Cudd_RecursiveDeref( dd, bFuncC );
            // add the number of used nodes
            (*pCounter) += 3;
        }
        else
        {
            // compute the result for both branches
            bFunc0 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin(pNode,0), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc0 == NULL )
                return NULL;
            Cudd_Ref( bFunc0 );
            bFunc1 = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin(pNode,1), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
            if ( bFunc1 == NULL )
                return NULL;
            Cudd_Ref( bFunc1 );
            bFunc0 = Cudd_NotCond( bFunc0, (int)Abc_ObjFaninC0(pNode) );
            bFunc1 = Cudd_NotCond( bFunc1, (int)Abc_ObjFaninC1(pNode) );
            // get the final result
            bFunc = Cudd_bddAndLimit( dd, bFunc0, bFunc1, nBddSizeMax );
            if ( bFunc == NULL )
                return NULL;
            Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc0 );
            Cudd_RecursiveDeref( dd, bFunc1 );
            // add the number of used nodes
            (*pCounter)++;
        }
        // set the result
        assert( Abc_ObjGlobalBdd(pNode) == NULL );
        Abc_ObjSetGlobalBdd( pNode, bFunc );
        // increment the progress bar
        if ( pProgress )
            Extra_ProgressBarUpdate( pProgress, *pCounter, NULL );
    }
    // prepare the return value
    bFunc = (DdNode *)Abc_ObjGlobalBdd(pNode);
    // dereference BDD at the node
    if ( --pNode->vFanouts.nSize == 0 && fDropInternal )
    {
        Cudd_Deref( bFunc );
        Abc_ObjSetGlobalBdd( pNode, NULL );
    }
    return bFunc;
}